

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::ParseVarintTest_Varint64_Test::TestBody
          (ParseVarintTest_Varint64_Test *this)

{
  int in_EDX;
  int varint_length_00;
  int varint_length;
  uint uVar1;
  uint64_t (*__range3) [5];
  ulong uVar2;
  long lVar3;
  uint64_t values [5];
  long local_48 [6];
  
  uVar1 = 1;
  uVar2 = 0x49;
  do {
    local_48[0] = uVar2 - 0x49;
    local_48[1] = uVar2 - 0x48;
    local_48[2] = uVar2;
    local_48[3] = uVar2 + 0x35;
    local_48[4] = uVar2 + 0x36;
    lVar3 = 0;
    do {
      TestBody::anon_class_1_0_00000001::operator()
                (*(anon_class_1_0_00000001 **)((long)local_48 + lVar3),(ulong)uVar1,in_EDX);
      lVar3 = lVar3 + 8;
      in_EDX = varint_length_00;
    } while (lVar3 != 0x28);
    uVar2 = uVar2 << 7 | 0x49;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0xb);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0xffffffffffffffff,10,varint_length_00);
  return;
}

Assistant:

TEST(ParseVarintTest, Varint64) {
  auto test_value = [](uint64_t value, int varint_length) {
    uint8_t buffer[10] = {0};
    uint8_t* p = io::CodedOutputStream::WriteVarint64ToArray(value, buffer);
    ASSERT_EQ(p - buffer, varint_length) << "Value = " << value;

    const char* cbuffer = reinterpret_cast<const char*>(buffer);
    uint64_t parsed = ~value;
    const char* r = internal::VarintParse(cbuffer, &parsed);
    ASSERT_EQ(r - cbuffer, varint_length) << "Value = " << value;
    ASSERT_EQ(parsed, value);
  };

  uint64_t base = 73;  // 1001011b
  for (int varint_length = 1; varint_length <= 10; ++varint_length) {
    uint64_t values[] = {
        base - 73, base - 72, base, base + 126 - 73, base + 126 - 72,
    };
    for (uint64_t value : values) {
      test_value(value, varint_length);
    }
    base = (base << 7) + 73;
  }

  test_value(std::numeric_limits<uint64_t>::max(), 10);
}